

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O1

void __thiscall Image::setPixel(Image *this,int x,int y,Vector3f *color)

{
  if ((x < 0) || (this->_width <= x)) {
    __assert_fail("x >= 0 && x < _width",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Image.h"
                  ,0x23,"void Image::setPixel(int, int, const Vector3f &)");
  }
  if ((-1 < y) && (y < this->_height)) {
    Vector3f::operator=((this->_data).super__Vector_base<Vector3f,_std::allocator<Vector3f>_>.
                        _M_impl.super__Vector_impl_data._M_start + (uint)(this->_width * y + x),
                        color);
    return;
  }
  __assert_fail("y >= 0 && y < _height",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Image.h"
                ,0x24,"void Image::setPixel(int, int, const Vector3f &)");
}

Assistant:

void setPixel(int x, int y, const Vector3f &color) {
        assert(x >= 0 && x < _width);
        assert(y >= 0 && y < _height);
        _data[y * _width + x] = color;
    }